

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slip.c
# Opt level: O0

void * slip_create(uint16_t size,void *ctx,_func_void_void_ptr_uint8_t_ptr_uint16_t *recv,
                  _func_void_void_ptr_uint8_t *putch)

{
  uint16_t *puVar1;
  slip *slip;
  _func_void_void_ptr_uint8_t *putch_local;
  _func_void_void_ptr_uint8_t_ptr_uint16_t *recv_local;
  void *ctx_local;
  uint16_t size_local;
  
  puVar1 = (uint16_t *)malloc((ulong)size + 0x28);
  *puVar1 = size;
  puVar1[1] = 0;
  *(_func_void_void_ptr_uint8_t_ptr_uint16_t **)(puVar1 + 0xc) = recv;
  *(void **)(puVar1 + 4) = ctx;
  *(_func_void_void_ptr_uint8_t **)(puVar1 + 0x10) = putch;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  return puVar1;
}

Assistant:

void *slip_create(uint16_t size,
                  void *ctx,
                  void (*recv)(void *ctx, const uint8_t *payload, uint16_t len),
                  void (*putch)(void *ctx, uint8_t ch))
{
    struct slip *slip = (struct slip*)malloc(sizeof(struct slip) + size);
    slip->size = size;
    slip->len = 0;
    slip->recv = recv;
    slip->ctx = ctx;
    slip->putch = putch;
    PT_INIT(&slip->pt);
    return (void *)slip;
}